

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

void xmlCleanURI(xmlURIPtr uri)

{
  xmlURIPtr uri_local;
  
  if (uri != (xmlURIPtr)0x0) {
    if (uri->scheme != (char *)0x0) {
      (*xmlFree)(uri->scheme);
    }
    uri->scheme = (char *)0x0;
    if (uri->server != (char *)0x0) {
      (*xmlFree)(uri->server);
    }
    uri->server = (char *)0x0;
    if (uri->user != (char *)0x0) {
      (*xmlFree)(uri->user);
    }
    uri->user = (char *)0x0;
    if (uri->path != (char *)0x0) {
      (*xmlFree)(uri->path);
    }
    uri->path = (char *)0x0;
    if (uri->fragment != (char *)0x0) {
      (*xmlFree)(uri->fragment);
    }
    uri->fragment = (char *)0x0;
    if (uri->opaque != (char *)0x0) {
      (*xmlFree)(uri->opaque);
    }
    uri->opaque = (char *)0x0;
    if (uri->authority != (char *)0x0) {
      (*xmlFree)(uri->authority);
    }
    uri->authority = (char *)0x0;
    if (uri->query != (char *)0x0) {
      (*xmlFree)(uri->query);
    }
    uri->query = (char *)0x0;
    if (uri->query_raw != (char *)0x0) {
      (*xmlFree)(uri->query_raw);
    }
    uri->query_raw = (char *)0x0;
  }
  return;
}

Assistant:

static void
xmlCleanURI(xmlURIPtr uri) {
    if (uri == NULL) return;

    if (uri->scheme != NULL) xmlFree(uri->scheme);
    uri->scheme = NULL;
    if (uri->server != NULL) xmlFree(uri->server);
    uri->server = NULL;
    if (uri->user != NULL) xmlFree(uri->user);
    uri->user = NULL;
    if (uri->path != NULL) xmlFree(uri->path);
    uri->path = NULL;
    if (uri->fragment != NULL) xmlFree(uri->fragment);
    uri->fragment = NULL;
    if (uri->opaque != NULL) xmlFree(uri->opaque);
    uri->opaque = NULL;
    if (uri->authority != NULL) xmlFree(uri->authority);
    uri->authority = NULL;
    if (uri->query != NULL) xmlFree(uri->query);
    uri->query = NULL;
    if (uri->query_raw != NULL) xmlFree(uri->query_raw);
    uri->query_raw = NULL;
}